

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O2

void __thiscall YdiskRestClient::removeResource(YdiskRestClient *this,string *utf8Path)

{
  char *this_00;
  Client *this_01;
  shared_ptr<httplib::Response> r;
  string url;
  undefined1 local_50 [64];
  
  this_00 = "/v1/disk/resources?path=";
  std::__cxx11::string::string
            ((string *)(local_50 + 0x20),"/v1/disk/resources?path=",(allocator *)local_50);
  url_encode((string *)local_50,(YdiskRestClient *)this_00,utf8Path);
  std::__cxx11::string::append((string *)(local_50 + 0x20));
  std::__cxx11::string::~string((string *)local_50);
  this_01 = (Client *)local_50;
  httplib::Client::Delete(this_01,(char *)this->http_client,(Headers *)local_50._32_8_);
  if ((Response *)local_50._0_8_ == (Response *)0x0) {
LAB_0015532d:
    throw_response_error((YdiskRestClient *)this_01,(Response *)local_50._0_8_);
  }
  else if (*(int *)(local_50._0_8_ + 0x20) != 0xca) {
    if (*(int *)(local_50._0_8_ + 0x20) == 0xcc) goto LAB_0015533e;
    goto LAB_0015532d;
  }
  wait_success_operation(this,&((Response *)local_50._0_8_)->body);
LAB_0015533e:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  std::__cxx11::string::~string((string *)(local_50 + 0x20));
  return;
}

Assistant:

void YdiskRestClient::removeResource(std::string utf8Path)
{
    std::string url("/v1/disk/resources?path=");
    url += url_encode(utf8Path);
    auto r = http_client->Delete(url.c_str(), headers);

    if(r.get() && r->status==204){
        //empty folder or file was removed
        return;
    } else if(r.get() && r->status==202){
        //not empty folder is removing, get operation status
        wait_success_operation(r->body);
        return;
    } else {
        throw_response_error(r.get());
    }
}